

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int Cba_ObjRight(Cba_Ntk_t *p,int i)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  
  if (i < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                  ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
  }
  if (i < (p->vObjFon0).nSize) {
    iVar2 = (p->vObjFon0).pArray[(uint)i];
    if ((long)iVar2 < 1) {
      __assert_fail("Cba_FonIsReal(f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0x113,"int Cba_FonRange(Cba_Ntk_t *, int)");
    }
    if ((p->vFonRange).nSize < 1) {
      uVar3 = 0;
    }
    else {
      Vec_IntFillExtra(&p->vFonRange,iVar2 + 1,0);
      if ((p->vFonRange).nSize <= iVar2) goto LAB_003d2aa7;
      uVar3 = (p->vFonRange).pArray[iVar2];
    }
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    iVar2 = 0;
    if (1 < uVar3) {
      pVVar1 = p->pDesign->vHash->vObjs;
      uVar3 = uVar3 * 2 & 0xfffffffc;
      if (pVVar1->nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar2 = pVVar1->pArray[(ulong)uVar3 + 1];
    }
    return iVar2;
  }
LAB_003d2aa7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int            Cba_ObjRight( Cba_Ntk_t * p, int i )            { return Cba_FonRight( p, Cba_ObjFon0(p, i) );                                                }